

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

void Mvc_CoverSupportAnd(Mvc_Cover_t *pCover,Mvc_Cube_t *pSupp)

{
  int _i_;
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  Mvc_Cube_t *pMVar5;
  
  uVar1 = *(uint *)&pSupp->field_0x8;
  uVar4 = uVar1 & 0xffffff;
  bVar3 = (byte)(uVar1 >> 0x18);
  if ((ulong)uVar4 == 1) {
    pSupp->pData[0] = 0xffffffff;
    *(uint *)&pSupp->field_0x14 = 0xffffffff >> (bVar3 & 0x1f);
  }
  else if (uVar4 == 0) {
    pSupp->pData[0] = 0xffffffff >> (bVar3 & 0x1f);
  }
  else {
    pSupp->pData[uVar4] = 0xffffffff >> (bVar3 & 0x1f);
    for (uVar2 = (ulong)(uVar1 & 0xffffff); 0 < (long)uVar2; uVar2 = uVar2 - 1) {
      pSupp->pData[uVar2 - 1] = 0xffffffff;
    }
  }
  pMVar5 = (Mvc_Cube_t *)&pCover->lCubes;
  while (pMVar5 = pMVar5->pNext, pMVar5 != (Mvc_Cube_t *)0x0) {
    if (uVar4 == 0) {
      pSupp->pData[0] = pSupp->pData[0] & pMVar5->pData[0];
    }
    else {
      uVar1 = uVar4;
      if (uVar4 == 1) {
        pSupp->pData[0] = pSupp->pData[0] & pMVar5->pData[0];
        *(uint *)&pSupp->field_0x14 = *(uint *)&pSupp->field_0x14 & *(uint *)&pMVar5->field_0x14;
      }
      else {
        for (; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
          pSupp->pData[uVar1] = pSupp->pData[uVar1] & pMVar5->pData[uVar1];
        }
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverSupportAnd( Mvc_Cover_t * pCover, Mvc_Cube_t * pSupp )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitFill( pSupp );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitAnd( pSupp, pSupp, pCube );
}